

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

token * libchars::lexer(string *str)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  token *this;
  string local_78 [48];
  token *local_48;
  token *T;
  uint32_t tr;
  lex_inputs x;
  char c;
  size_t sStack_30;
  uint32_t state;
  size_t offset_start;
  size_t offset;
  token *t_head;
  token *t_tail;
  string *str_local;
  
  t_head = (token *)0x0;
  offset = 0;
  offset_start = 0;
  sStack_30 = 0;
  x = X_WS;
  t_tail = (token *)str;
  do {
    sVar1 = offset_start;
    uVar3 = std::__cxx11::string::length();
    if (sVar1 < uVar3) {
      pcVar4 = (char *)std::__cxx11::string::at((ulong)t_tail);
      tr._3_1_ = *pcVar4;
    }
    else {
      tr._3_1_ = '\0';
    }
    T._4_4_ = 0;
    if (tr._3_1_ == '\0') {
      T._4_4_ = 4;
    }
    else if (tr._3_1_ == '\\') {
      T._4_4_ = 3;
    }
    else if (tr._3_1_ == '\"') {
      T._4_4_ = 2;
    }
    else {
      iVar2 = isspace((int)tr._3_1_);
      if ((iVar2 == 0) && (tr._3_1_ != '=')) {
        iVar2 = isprint((int)tr._3_1_);
        if (iVar2 != 0) {
          T._4_4_ = 1;
        }
      }
      else {
        T._4_4_ = 0;
      }
    }
    uVar3 = sStack_30;
    T._0_4_ = *(lex_inputs *)(lex_transitions + (ulong)T._4_4_ * 4 + (ulong)x * 0x14);
    if (((((lex_inputs)T & 0xc0) != X_WS) && (sStack_30 < offset_start)) &&
       (uVar5 = std::__cxx11::string::length(), uVar3 < uVar5)) {
      this = (token *)operator_new(0x90);
      token::token(this,UNKNOWN,-1,0,(char *)0x0);
      this->status = 0x10;
      if ((x == X_Q) || (x == X_EOL)) {
        this->status = this->status | 0x400;
      }
      this->offset = sStack_30;
      this->length = offset_start - sStack_30;
      if (((lex_inputs)T & 0x80) != X_WS) {
        this->length = this->length + 1;
      }
      local_48 = this;
      std::__cxx11::string::substr((ulong)local_78,(ulong)t_tail);
      std::__cxx11::string::operator=((string *)local_48,local_78);
      std::__cxx11::string::~string(local_78);
      if (offset == 0) {
        t_head = local_48;
      }
      else {
        *(token **)(offset + 0x88) = local_48;
      }
      offset = (size_t)local_48;
    }
    sVar1 = offset_start;
    if (((lex_inputs)T & 0x10) != X_WS) {
      sStack_30 = offset_start;
    }
    x = (lex_inputs)T & 0xf;
    offset_start = offset_start + 1;
    uVar3 = std::__cxx11::string::length();
  } while (sVar1 < uVar3);
  return t_head;
}

Assistant:

token *lexer(const std::string &str)
    {
        token *t_tail = NULL;
        token *t_head = NULL;
        size_t offset = 0, offset_start = 0;
        uint32_t state = S_WS;
        do {
            char c = (offset < str.length()) ? str.at(offset) : 0;
            lex_inputs x = X_WS;
            if (c == 0)
                x = X_EOL;
            else if (c == '\\')
                x = X_ESC;
            else if (c == '"')
                x = X_Q;
            else if (isspace(c) || c == '=')
                x = X_WS;
            else if (isprint(c))
                x = X_A0;

            uint32_t tr = lex_transitions[state][x];
            if ((tr & (A_PUSH|A_EOTP)) != 0) {
                // character part of existing token
            }
            if ((tr & (A_EOT|A_EOTP)) != 0) {
                // end of token (if not empty)
                if (offset > offset_start && offset_start < str.length()) {
                    token *T = new token;
                    T->status = token::IN_STRING;
                    if (state == S_STR || state == S_E2)
                        T->status |= token::IS_QUOTED;
                    T->offset = offset_start;
                    T->length = offset - offset_start;
                    if (tr & A_EOTP) ++T->length;
                    T->value = str.substr(T->offset,T->length);
                    if (t_head == NULL) {
                        t_head = t_tail = T;
                    }
                    else {
                        t_head->next = T;
                        t_head = T;
                    }
                }
            }
            if ((tr & A_SOT) != 0) {
                // new token
                offset_start = offset;
            }
            state = tr & 0x0f;
        } while (offset++ < str.length());

        return t_tail;
    }